

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O1

bool duckdb::ExtensionTypeInfo::Equals
               (optional_ptr<duckdb::ExtensionTypeInfo,_true> lhs,
               optional_ptr<duckdb::ExtensionTypeInfo,_true> rhs)

{
  optional_ptr<duckdb::ExtensionTypeInfo,_true> this;
  optional_ptr<duckdb::ExtensionTypeInfo,_true> oVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  ulong uVar5;
  const_reference this_00;
  const_reference rhs_00;
  const_iterator cVar6;
  ulong uVar7;
  ExtensionTypeInfo *in_RSI;
  ExtensionTypeInfo *in_RDI;
  size_type __n;
  _Hash_node_base *p_Var8;
  optional_ptr<duckdb::ExtensionTypeInfo,_true> local_48;
  optional_ptr<duckdb::ExtensionTypeInfo,_true> local_40;
  ExtensionTypeInfo *local_38;
  
  bVar3 = true;
  if (((in_RSI != (ExtensionTypeInfo *)0x0) && (in_RDI != (ExtensionTypeInfo *)0x0)) &&
     (in_RDI != in_RSI)) {
    local_48.ptr = in_RSI;
    local_40.ptr = in_RDI;
    optional_ptr<duckdb::ExtensionTypeInfo,_true>::CheckValid(&local_40);
    oVar1.ptr = local_40.ptr;
    optional_ptr<duckdb::ExtensionTypeInfo,_true>::CheckValid(&local_48);
    this.ptr = local_48.ptr;
    local_38 = oVar1.ptr;
    uVar5 = ((long)((oVar1.ptr)->modifiers).
                   super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   .
                   super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)((oVar1.ptr)->modifiers).
                   super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   .
                   super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
    uVar7 = ((long)((local_48.ptr)->modifiers).
                   super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   .
                   super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)((local_48.ptr)->modifiers).
                   super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   .
                   super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
    if (uVar5 < uVar7) {
      uVar7 = uVar5;
    }
    if (uVar7 != 0) {
      __n = 0;
      do {
        this_00 = vector<duckdb::LogicalTypeModifier,_true>::operator[](&local_38->modifiers,__n);
        rhs_00 = vector<duckdb::LogicalTypeModifier,_true>::operator[](&(this.ptr)->modifiers,__n);
        bVar3 = true;
        if (((((this_00->value).type_.id_ == (rhs_00->value).type_.id_) &&
             (bVar2 = LogicalType::EqualTypeInfo((LogicalType *)this_00,(LogicalType *)rhs_00),
             bVar2)) &&
            ((bVar2 = (this_00->value).is_null, bVar2 != true ||
             (bVar3 = false, (rhs_00->value).is_null == false)))) &&
           (bVar3 = true, bVar2 == (rhs_00->value).is_null)) {
          bVar3 = Value::operator!=(&this_00->value,&rhs_00->value);
        }
        if (bVar3 != false) {
          return false;
        }
        __n = __n + 1;
      } while (uVar7 != __n);
    }
    optional_ptr<duckdb::ExtensionTypeInfo,_true>::CheckValid(&local_40);
    optional_ptr<duckdb::ExtensionTypeInfo,_true>::CheckValid(&local_48);
    p_Var8 = ((local_40.ptr)->properties)._M_h._M_before_begin._M_nxt;
    bVar3 = p_Var8 == (_Hash_node_base *)0x0;
    if (!bVar3) {
      do {
        cVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&((local_48.ptr)->properties)._M_h,(key_type *)(p_Var8 + 1));
        if (cVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            ._M_cur == (__node_type *)0x0) {
          cVar4 = '\x06';
        }
        else {
          cVar4 = Value::operator!=((Value *)(p_Var8 + 5),
                                    (Value *)((long)cVar6.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                                  ._M_cur + 0x28));
        }
        if ((cVar4 != '\x06') && (cVar4 != '\0')) {
          return bVar3;
        }
        p_Var8 = p_Var8->_M_nxt;
        bVar3 = p_Var8 == (_Hash_node_base *)0x0;
      } while (!bVar3);
    }
  }
  return bVar3;
}

Assistant:

bool ExtensionTypeInfo::Equals(optional_ptr<ExtensionTypeInfo> lhs, optional_ptr<ExtensionTypeInfo> rhs) {
	// Either both are null, or both are the same, so they are equal
	if (lhs.get() == rhs.get()) {
		return true;
	}
	// If one is null, then we cant compare them
	if (lhs == nullptr || rhs == nullptr) {
		return true;
	}

	// Both are not null, so we can compare them
	D_ASSERT(lhs != nullptr && rhs != nullptr);

	// Compare modifiers
	const auto &lhs_mods = lhs->modifiers;
	const auto &rhs_mods = rhs->modifiers;
	const auto common_mods = MinValue(lhs_mods.size(), rhs_mods.size());
	for (idx_t i = 0; i < common_mods; i++) {
		// If the types are not strictly equal, they are not equal
		auto &lhs_val = lhs_mods[i].value;
		auto &rhs_val = rhs_mods[i].value;

		if (lhs_val.type() != rhs_val.type()) {
			return false;
		}

		// If both are null, its fine
		if (lhs_val.IsNull() && rhs_val.IsNull()) {
			continue;
		}

		// If one is null, the other must be null too
		if (lhs_val.IsNull() != rhs_val.IsNull()) {
			return false;
		}

		if (lhs_val != rhs_val) {
			return false;
		}
	}

	// Properties are optional, so only compare those present in both
	const auto &lhs_props = lhs->properties;
	const auto &rhs_props = rhs->properties;

	for (const auto &kv : lhs_props) {
		auto it = rhs_props.find(kv.first);
		if (it == rhs_props.end()) {
			// Continue
			continue;
		}
		if (kv.second != it->second) {
			// Mismatch!
			return false;
		}
	}

	// All ok!
	return true;
}